

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_ChangeVelocity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *pAVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  void *local_60;
  double local_58;
  double local_48;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003dae8b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dae7b:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dae8b:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12c4,
                  "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_003dac30;
    pPVar4 = (pAVar5->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pAVar5->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar8 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar8) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dae8b;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_003dae7b;
LAB_003dac30:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003daf19:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c5,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_60 = param[1].field_0.field_1.a;
LAB_003dac80:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003daf38:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c6,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_48 = param[2].field_0.f;
LAB_003dac8f:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003daee8:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c7,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_58 = param[3].field_0.f;
LAB_003dac9e:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003daec9:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c8,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar7 = param[4].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003daf19;
    }
    local_60 = (void *)param[1].field_0.f;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003dac80;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003daf38;
    }
    local_48 = param[2].field_0.f;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003dac8f;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003daee8;
    }
    local_58 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003dac9e;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003daec9;
    }
    uVar7 = param[4].field_0.i;
    if (numparam != 5) {
      if (param[5].field_0.field_3.Type != '\0') {
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003daeaa;
      }
      goto LAB_003dacc8;
    }
    param = defaultparam->Array;
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003daeaa:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12c9,
                  "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003dacc8:
  pAVar5 = COPY_AAPTR(pAVar5,param[5].field_0.i);
  if (pAVar5 != (AActor *)0x0) {
    dVar9 = (pAVar5->Vel).X;
    bVar1 = false;
    bVar8 = false;
    if ((((dVar9 == 0.0) && (bVar8 = bVar1, !NAN(dVar9))) && (dVar9 = (pAVar5->Vel).Y, dVar9 == 0.0)
        ) && (!NAN(dVar9))) {
      bVar8 = (pAVar5->Vel).Z == 0.0;
    }
    dVar9 = FFastTrig::sin(&fasttrig,
                           (pAVar5->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
    dVar10 = FFastTrig::cos(&fasttrig,
                            (pAVar5->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
    if ((uVar7 & 1) != 0) {
      dVar11 = local_48 * dVar9;
      local_48 = local_48 * dVar10 + (double)local_60 * dVar9;
      local_60 = (void *)((double)local_60 * dVar10 - dVar11);
    }
    if ((uVar7 & 2) == 0) {
      (pAVar5->Vel).X = (double)local_60 + (pAVar5->Vel).X;
      (pAVar5->Vel).Y = local_48 + (pAVar5->Vel).Y;
      (pAVar5->Vel).Z = local_58 + (pAVar5->Vel).Z;
    }
    else {
      (pAVar5->Vel).Z = local_58;
      (pAVar5->Vel).Y = local_48;
      (pAVar5->Vel).X = (double)local_60;
    }
    if (!bVar8) {
      CheckStopped(pAVar5);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeVelocity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT_DEF	(x)		
	PARAM_FLOAT_DEF	(y)		
	PARAM_FLOAT_DEF	(z)		
	PARAM_INT_DEF	(flags)	
	PARAM_INT_DEF	(ptr)	

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref == NULL)
	{
		return 0;
	}

	INTBOOL was_moving = !ref->Vel.isZero();

	DVector3 vel(x, y, z);
	double sina = ref->Angles.Yaw.Sin();
	double cosa = ref->Angles.Yaw.Cos();

	if (flags & 1)	// relative axes - make x, y relative to actor's current angle
	{
		vel.X = x*cosa - y*sina;
		vel.Y = x*sina + y*cosa;
	}
	if (flags & 2)	// discard old velocity - replace old velocity with new velocity
	{
		ref->Vel = vel;
	}
	else	// add new velocity to old velocity
	{
		ref->Vel += vel;
	}

	if (was_moving)
	{
		CheckStopped(ref);
	}
	return 0;
}